

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  Arena *pAVar1;
  Rep *pRVar2;
  CppType CVar3;
  int iVar4;
  int iVar5;
  LogMessage *pLVar6;
  RepeatedField<long> *pRVar7;
  RepeatedField<unsigned_int> *pRVar8;
  RepeatedField<unsigned_long> *pRVar9;
  RepeatedField<float> *pRVar10;
  RepeatedField<double> *pRVar11;
  RepeatedField<bool> *pRVar12;
  RepeatedField<int> *pRVar13;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar14;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar15;
  undefined4 extraout_var;
  int64 iVar16;
  undefined8 uVar17;
  long *plVar18;
  LogFinisher local_55a;
  byte local_559;
  LogMessage local_558;
  LogFinisher local_51a;
  byte local_519;
  LogMessage local_518;
  LogFinisher local_4da;
  byte local_4d9;
  LogMessage local_4d8;
  undefined1 local_499;
  Extension *pEStack_498;
  bool is_new_1;
  Extension *extension_1;
  MessageLite *target;
  MessageLite *other_message;
  RepeatedPtrField<google::protobuf::MessageLite> *pRStack_478;
  int i;
  RepeatedPtrField<google::protobuf::MessageLite> *other_repeated_message;
  LogMessage local_468;
  LogFinisher local_42a;
  byte local_429;
  LogMessage local_428;
  LogFinisher local_3ed [20];
  byte local_3d9;
  LogMessage local_3d8;
  byte local_399;
  Extension *pEStack_398;
  bool is_new;
  Extension *extension;
  Extension *other_extension_local;
  ExtensionSet *pEStack_380;
  int number_local;
  ExtensionSet *this_local;
  Arena *local_368;
  RepeatedField<int> *local_360;
  Arena *local_348;
  RepeatedField<int> *local_340;
  Arena *local_328;
  RepeatedField<long> *local_320;
  Arena *local_308;
  RepeatedField<unsigned_int> *local_300;
  Arena *local_2e8;
  RepeatedField<unsigned_long> *local_2e0;
  Arena *local_2c8;
  RepeatedField<float> *local_2c0;
  Arena *local_2a8;
  RepeatedField<double> *local_2a0;
  Arena *local_288;
  RepeatedField<bool> *local_280;
  Rep *local_268;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  Rep *local_248;
  RepeatedPtrField<google::protobuf::MessageLite> *local_240;
  Arena *local_238;
  Rep *local_230;
  Arena *local_228;
  Arena *local_220;
  Rep *local_218;
  Arena *local_210;
  RepeatedField<int> *local_208;
  RepeatedField<int> *t_7;
  byte local_1f1;
  Arena *local_1f0;
  RepeatedField<int> *local_1e8;
  RepeatedField<int> *t;
  byte local_1d1;
  Arena *local_1d0;
  Arena *local_1c8;
  Rep *local_1c0;
  Arena *local_1b8;
  RepeatedField<long> *local_1b0;
  RepeatedField<long> *t_1;
  byte local_199;
  Arena *local_198;
  Arena *local_190;
  Rep *local_188;
  Arena *local_180;
  RepeatedField<unsigned_int> *local_178;
  RepeatedField<unsigned_int> *t_2;
  byte local_161;
  Arena *local_160;
  Arena *local_158;
  Rep *local_150;
  Arena *local_148;
  RepeatedField<unsigned_long> *local_140;
  RepeatedField<unsigned_long> *t_3;
  byte local_129;
  Arena *local_128;
  Arena *local_120;
  Rep *local_118;
  Arena *local_110;
  RepeatedField<float> *local_108;
  RepeatedField<float> *t_4;
  byte local_f1;
  Arena *local_f0;
  Arena *local_e8;
  Rep *local_e0;
  Arena *local_d8;
  RepeatedField<double> *local_d0;
  RepeatedField<double> *t_5;
  byte local_b9;
  Arena *local_b8;
  Arena *local_b0;
  Rep *local_a8;
  Arena *local_a0;
  RepeatedField<bool> *local_98;
  RepeatedField<bool> *t_6;
  byte local_81;
  Arena *local_80;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *t_8;
  byte local_49;
  Rep *local_48;
  RepeatedPtrField<google::protobuf::MessageLite> local_40;
  RepeatedPtrField<google::protobuf::MessageLite> *local_28;
  RepeatedPtrField<google::protobuf::MessageLite> *t_9;
  byte local_11;
  Rep *local_10;
  
  extension = other_extension;
  other_extension_local._4_4_ = number;
  pEStack_380 = this;
  if ((other_extension->is_repeated & 1U) == 0) {
    if ((other_extension->field_0xa & 1) == 0) {
      CVar3 = anon_unknown_29::cpp_type(other_extension->type);
      switch(CVar3) {
      case CPPTYPE_INT32:
        SetInt32(this,other_extension_local._4_4_,extension->type,(extension->field_0).int32_value,
                 extension->descriptor);
        break;
      case CPPTYPE_INT64:
        SetInt64(this,other_extension_local._4_4_,extension->type,(extension->field_0).int64_value,
                 extension->descriptor);
        break;
      case CPPTYPE_UINT32:
        SetUInt32(this,other_extension_local._4_4_,extension->type,(extension->field_0).uint32_value
                  ,extension->descriptor);
        break;
      case CPPTYPE_UINT64:
        SetUInt64(this,other_extension_local._4_4_,extension->type,(extension->field_0).uint64_value
                  ,extension->descriptor);
        break;
      case CPPTYPE_DOUBLE:
        SetDouble(this,other_extension_local._4_4_,extension->type,(extension->field_0).double_value
                  ,extension->descriptor);
        break;
      case CPPTYPE_FLOAT:
        SetFloat(this,other_extension_local._4_4_,extension->type,(extension->field_0).float_value,
                 extension->descriptor);
        break;
      case CPPTYPE_BOOL:
        SetBool(this,other_extension_local._4_4_,extension->type,
                (bool)((extension->field_0).bool_value & 1),extension->descriptor);
        break;
      case CPPTYPE_ENUM:
        SetEnum(this,other_extension_local._4_4_,extension->type,(extension->field_0).enum_value,
                extension->descriptor);
        break;
      case CPPTYPE_STRING:
        SetString(this,other_extension_local._4_4_,extension->type,(extension->field_0).string_value
                  ,extension->descriptor);
        break;
      case CPPTYPE_MESSAGE:
        local_499 = MaybeNewExtension(this,other_extension_local._4_4_,extension->descriptor,
                                      &stack0xfffffffffffffb68);
        if ((bool)local_499) {
          pEStack_498->type = extension->type;
          pEStack_498->is_packed = (bool)(extension->is_packed & 1);
          pEStack_498->is_repeated = false;
          if (((byte)extension->field_0xa >> 4 & 1) == 0) {
            pEStack_498->field_0xa = pEStack_498->field_0xa & 0xf;
            iVar16 = (**(code **)((((extension->field_0).repeated_string_value)->
                                  super_RepeatedPtrFieldBase).arena_ + 0x20))
                               ((extension->field_0).repeated_string_value,this->arena_);
            (pEStack_498->field_0).int64_value = iVar16;
            (**(code **)((((pEStack_498->field_0).repeated_string_value)->super_RepeatedPtrFieldBase
                         ).arena_ + 0x50))
                      ((pEStack_498->field_0).repeated_string_value,(extension->field_0).int64_value
                      );
          }
          else {
            pEStack_498->field_0xa = pEStack_498->field_0xa & 0xf | 0x10;
            iVar16 = (**(code **)((((extension->field_0).repeated_string_value)->
                                  super_RepeatedPtrFieldBase).arena_ + 0x10))
                               ((extension->field_0).repeated_string_value,this->arena_);
            (pEStack_498->field_0).int64_value = iVar16;
            (**(code **)((((pEStack_498->field_0).repeated_string_value)->super_RepeatedPtrFieldBase
                         ).arena_ + 0x60))
                      ((pEStack_498->field_0).repeated_string_value,(extension->field_0).int64_value
                      );
          }
        }
        else {
          local_4d9 = 0;
          if (pEStack_498->type != extension->type) {
            LogMessage::LogMessage
                      (&local_4d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                       ,0x3d9);
            local_4d9 = 1;
            pLVar6 = LogMessage::operator<<
                               (&local_4d8,
                                "CHECK failed: (extension->type) == (other_extension.type): ");
            LogFinisher::operator=(&local_4da,pLVar6);
          }
          if ((local_4d9 & 1) != 0) {
            LogMessage::~LogMessage(&local_4d8);
          }
          local_519 = 0;
          if ((pEStack_498->is_packed & 1U) != (extension->is_packed & 1U)) {
            LogMessage::LogMessage
                      (&local_518,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                       ,0x3da);
            local_519 = 1;
            pLVar6 = LogMessage::operator<<
                               (&local_518,
                                "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                               );
            LogFinisher::operator=(&local_51a,pLVar6);
          }
          if ((local_519 & 1) != 0) {
            LogMessage::~LogMessage(&local_518);
          }
          local_559 = 0;
          if ((pEStack_498->is_repeated & 1U) != 0) {
            LogMessage::LogMessage
                      (&local_558,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                       ,0x3db);
            local_559 = 1;
            pLVar6 = LogMessage::operator<<(&local_558,"CHECK failed: !extension->is_repeated: ");
            LogFinisher::operator=(&local_55a,pLVar6);
          }
          if ((local_559 & 1) != 0) {
            LogMessage::~LogMessage(&local_558);
          }
          if (((byte)extension->field_0xa >> 4 & 1) == 0) {
            if (((byte)pEStack_498->field_0xa >> 4 & 1) == 0) {
              (**(code **)((((pEStack_498->field_0).repeated_string_value)->
                           super_RepeatedPtrFieldBase).arena_ + 0x50))
                        ((pEStack_498->field_0).repeated_string_value,
                         (extension->field_0).int64_value);
            }
            else {
              plVar18 = (long *)(**(code **)((((pEStack_498->field_0).repeated_string_value)->
                                             super_RepeatedPtrFieldBase).arena_ + 0x20))
                                          ((pEStack_498->field_0).repeated_string_value,
                                           (extension->field_0).int64_value);
              (**(code **)(*plVar18 + 0x50))(plVar18,(extension->field_0).int64_value);
            }
          }
          else if (((byte)pEStack_498->field_0xa >> 4 & 1) == 0) {
            pRVar14 = (pEStack_498->field_0).repeated_string_value;
            uVar17 = (**(code **)((((extension->field_0).repeated_string_value)->
                                  super_RepeatedPtrFieldBase).arena_ + 0x18))
                               ((extension->field_0).repeated_string_value,
                                (pEStack_498->field_0).int64_value);
            (**(code **)((pRVar14->super_RepeatedPtrFieldBase).arena_ + 0x50))(pRVar14,uVar17);
          }
          else {
            (**(code **)((((pEStack_498->field_0).repeated_string_value)->super_RepeatedPtrFieldBase
                         ).arena_ + 0x60))
                      ((pEStack_498->field_0).repeated_string_value,(extension->field_0).int64_value
                      );
          }
        }
        pEStack_498->field_0xa = pEStack_498->field_0xa & 0xf0;
      }
    }
  }
  else {
    local_399 = MaybeNewExtension(this,number,other_extension->descriptor,&stack0xfffffffffffffc68);
    if ((bool)local_399) {
      pEStack_398->type = extension->type;
      pEStack_398->is_packed = (bool)(extension->is_packed & 1);
      pEStack_398->is_repeated = true;
    }
    else {
      local_3d9 = 0;
      if (pEStack_398->type != extension->type) {
        LogMessage::LogMessage
                  (&local_3d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x37a);
        local_3d9 = 1;
        pLVar6 = LogMessage::operator<<
                           (&local_3d8,"CHECK failed: (extension->type) == (other_extension.type): "
                           );
        LogFinisher::operator=(local_3ed,pLVar6);
      }
      if ((local_3d9 & 1) != 0) {
        LogMessage::~LogMessage(&local_3d8);
      }
      local_429 = 0;
      if ((pEStack_398->is_packed & 1U) != (extension->is_packed & 1U)) {
        LogMessage::LogMessage
                  (&local_428,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x37b);
        local_429 = 1;
        pLVar6 = LogMessage::operator<<
                           (&local_428,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=(&local_42a,pLVar6);
      }
      if ((local_429 & 1) != 0) {
        LogMessage::~LogMessage(&local_428);
      }
      other_repeated_message._7_1_ = 0;
      if ((pEStack_398->is_repeated & 1U) == 0) {
        LogMessage::LogMessage
                  (&local_468,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x37c);
        other_repeated_message._7_1_ = 1;
        pLVar6 = LogMessage::operator<<(&local_468,"CHECK failed: extension->is_repeated: ");
        LogFinisher::operator=((LogFinisher *)((long)&other_repeated_message + 6),pLVar6);
      }
      if ((other_repeated_message._7_1_ & 1) != 0) {
        LogMessage::~LogMessage(&local_468);
      }
    }
    CVar3 = anon_unknown_29::cpp_type(extension->type);
    switch(CVar3) {
    case CPPTYPE_INT32:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_348 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar13 = (RepeatedField<int> *)operator_new(0x10);
          RepeatedField<int>::RepeatedField(pRVar13);
          local_340 = pRVar13;
        }
        else {
          local_230 = (Rep *)0x0;
          local_228 = pAVar1;
          local_1d1 = Arena::SkipDeleteList<google::protobuf::RepeatedField<int>>(0);
          t = (RepeatedField<int> *)&local_238;
          local_238 = pAVar1;
          local_1d0 = pAVar1;
          pRVar13 = (RepeatedField<int> *)
                    Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          RepeatedField<int>::RepeatedField(pRVar13,*(Arena **)t);
          local_1e8 = pRVar13;
          if ((local_1d1 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar13,
                               arena_destruct_object<google::protobuf::RepeatedField<int>>);
          }
          local_340 = local_1e8;
        }
        (pEStack_398->field_0).repeated_int32_value = local_340;
      }
      RepeatedField<int>::MergeFrom
                ((pEStack_398->field_0).repeated_int32_value,
                 (extension->field_0).repeated_int32_value);
      break;
    case CPPTYPE_INT64:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_328 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar7 = (RepeatedField<long> *)operator_new(0x10);
          RepeatedField<long>::RepeatedField(pRVar7);
          local_320 = pRVar7;
        }
        else {
          local_1c0 = (Rep *)0x0;
          local_1b8 = pAVar1;
          local_199 = Arena::SkipDeleteList<google::protobuf::RepeatedField<long>>(0);
          t_1 = (RepeatedField<long> *)&local_1c8;
          local_1c8 = pAVar1;
          local_198 = pAVar1;
          pRVar7 = (RepeatedField<long> *)
                   Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<long>::typeinfo,0x10);
          RepeatedField<long>::RepeatedField(pRVar7,*(Arena **)t_1);
          local_1b0 = pRVar7;
          if ((local_199 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar7,
                               arena_destruct_object<google::protobuf::RepeatedField<long>>);
          }
          local_320 = local_1b0;
        }
        (pEStack_398->field_0).repeated_int64_value = local_320;
      }
      RepeatedField<long>::MergeFrom
                ((pEStack_398->field_0).repeated_int64_value,
                 (extension->field_0).repeated_int64_value);
      break;
    case CPPTYPE_UINT32:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_308 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar8 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          RepeatedField<unsigned_int>::RepeatedField(pRVar8);
          local_300 = pRVar8;
        }
        else {
          local_188 = (Rep *)0x0;
          local_180 = pAVar1;
          local_161 = Arena::SkipDeleteList<google::protobuf::RepeatedField<unsigned_int>>(0);
          t_2 = (RepeatedField<unsigned_int> *)&local_190;
          local_190 = pAVar1;
          local_160 = pAVar1;
          pRVar8 = (RepeatedField<unsigned_int> *)
                   Arena::AllocateAligned
                             (pAVar1,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
          RepeatedField<unsigned_int>::RepeatedField(pRVar8,*(Arena **)t_2);
          local_178 = pRVar8;
          if ((local_161 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar8,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>)
            ;
          }
          local_300 = local_178;
        }
        (pEStack_398->field_0).repeated_uint32_value = local_300;
      }
      RepeatedField<unsigned_int>::MergeFrom
                ((pEStack_398->field_0).repeated_uint32_value,
                 (extension->field_0).repeated_uint32_value);
      break;
    case CPPTYPE_UINT64:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_2e8 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar9 = (RepeatedField<unsigned_long> *)operator_new(0x10);
          RepeatedField<unsigned_long>::RepeatedField(pRVar9);
          local_2e0 = pRVar9;
        }
        else {
          local_150 = (Rep *)0x0;
          local_148 = pAVar1;
          local_129 = Arena::SkipDeleteList<google::protobuf::RepeatedField<unsigned_long>>(0);
          t_3 = (RepeatedField<unsigned_long> *)&local_158;
          local_158 = pAVar1;
          local_128 = pAVar1;
          pRVar9 = (RepeatedField<unsigned_long> *)
                   Arena::AllocateAligned
                             (pAVar1,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
          RepeatedField<unsigned_long>::RepeatedField(pRVar9,*(Arena **)t_3);
          local_140 = pRVar9;
          if ((local_129 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar9,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>
                              );
          }
          local_2e0 = local_140;
        }
        (pEStack_398->field_0).repeated_uint64_value = local_2e0;
      }
      RepeatedField<unsigned_long>::MergeFrom
                ((pEStack_398->field_0).repeated_uint64_value,
                 (extension->field_0).repeated_uint64_value);
      break;
    case CPPTYPE_DOUBLE:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_2a8 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar11 = (RepeatedField<double> *)operator_new(0x10);
          RepeatedField<double>::RepeatedField(pRVar11);
          local_2a0 = pRVar11;
        }
        else {
          local_e0 = (Rep *)0x0;
          local_d8 = pAVar1;
          local_b9 = Arena::SkipDeleteList<google::protobuf::RepeatedField<double>>(0);
          t_5 = (RepeatedField<double> *)&local_e8;
          local_e8 = pAVar1;
          local_b8 = pAVar1;
          pRVar11 = (RepeatedField<double> *)
                    Arena::AllocateAligned
                              (pAVar1,(type_info *)&RepeatedField<double>::typeinfo,0x10);
          RepeatedField<double>::RepeatedField(pRVar11,*(Arena **)t_5);
          local_d0 = pRVar11;
          if ((local_b9 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar11,
                               arena_destruct_object<google::protobuf::RepeatedField<double>>);
          }
          local_2a0 = local_d0;
        }
        (pEStack_398->field_0).repeated_double_value = local_2a0;
      }
      RepeatedField<double>::MergeFrom
                ((pEStack_398->field_0).repeated_double_value,
                 (extension->field_0).repeated_double_value);
      break;
    case CPPTYPE_FLOAT:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_2c8 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar10 = (RepeatedField<float> *)operator_new(0x10);
          RepeatedField<float>::RepeatedField(pRVar10);
          local_2c0 = pRVar10;
        }
        else {
          local_118 = (Rep *)0x0;
          local_110 = pAVar1;
          local_f1 = Arena::SkipDeleteList<google::protobuf::RepeatedField<float>>(0);
          t_4 = (RepeatedField<float> *)&local_120;
          local_120 = pAVar1;
          local_f0 = pAVar1;
          pRVar10 = (RepeatedField<float> *)
                    Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<float>::typeinfo,0x10)
          ;
          RepeatedField<float>::RepeatedField(pRVar10,*(Arena **)t_4);
          local_108 = pRVar10;
          if ((local_f1 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar10,
                               arena_destruct_object<google::protobuf::RepeatedField<float>>);
          }
          local_2c0 = local_108;
        }
        (pEStack_398->field_0).repeated_float_value = local_2c0;
      }
      RepeatedField<float>::MergeFrom
                ((pEStack_398->field_0).repeated_float_value,
                 (extension->field_0).repeated_float_value);
      break;
    case CPPTYPE_BOOL:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_288 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar12 = (RepeatedField<bool> *)operator_new(0x10);
          RepeatedField<bool>::RepeatedField(pRVar12);
          local_280 = pRVar12;
        }
        else {
          local_a8 = (Rep *)0x0;
          local_a0 = pAVar1;
          local_81 = Arena::SkipDeleteList<google::protobuf::RepeatedField<bool>>(0);
          t_6 = (RepeatedField<bool> *)&local_b0;
          local_b0 = pAVar1;
          local_80 = pAVar1;
          pRVar12 = (RepeatedField<bool> *)
                    Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
          RepeatedField<bool>::RepeatedField(pRVar12,*(Arena **)t_6);
          local_98 = pRVar12;
          if ((local_81 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar12,
                               arena_destruct_object<google::protobuf::RepeatedField<bool>>);
          }
          local_280 = local_98;
        }
        (pEStack_398->field_0).repeated_bool_value = local_280;
      }
      RepeatedField<bool>::MergeFrom
                ((pEStack_398->field_0).repeated_bool_value,(extension->field_0).repeated_bool_value
                );
      break;
    case CPPTYPE_ENUM:
      if ((local_399 & 1) != 0) {
        pAVar1 = this->arena_;
        local_368 = pAVar1;
        if (pAVar1 == (Arena *)0x0) {
          pRVar13 = (RepeatedField<int> *)operator_new(0x10);
          RepeatedField<int>::RepeatedField(pRVar13);
          local_360 = pRVar13;
        }
        else {
          local_218 = (Rep *)0x0;
          local_210 = pAVar1;
          local_1f1 = Arena::SkipDeleteList<google::protobuf::RepeatedField<int>>(0);
          t_7 = (RepeatedField<int> *)&local_220;
          local_220 = pAVar1;
          local_1f0 = pAVar1;
          pRVar13 = (RepeatedField<int> *)
                    Arena::AllocateAligned(pAVar1,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          RepeatedField<int>::RepeatedField(pRVar13,*(Arena **)t_7);
          local_208 = pRVar13;
          if ((local_1f1 & 1) == 0) {
            Arena::AddListNode(pAVar1,pRVar13,
                               arena_destruct_object<google::protobuf::RepeatedField<int>>);
          }
          local_360 = local_208;
        }
        (pEStack_398->field_0).repeated_int32_value = local_360;
      }
      RepeatedField<int>::MergeFrom
                ((pEStack_398->field_0).repeated_int32_value,
                 (extension->field_0).repeated_int32_value);
      break;
    case CPPTYPE_STRING:
      if ((local_399 & 1) != 0) {
        pRVar2 = (Rep *)this->arena_;
        local_268 = pRVar2;
        if (pRVar2 == (Rep *)0x0) {
          pRVar14 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)operator_new(0x18);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::RepeatedPtrField(pRVar14);
          local_260 = pRVar14;
        }
        else {
          local_78.super_RepeatedPtrFieldBase.current_size_ = 0;
          local_78.super_RepeatedPtrFieldBase.total_size_ = 0;
          local_78.super_RepeatedPtrFieldBase.rep_ = pRVar2;
          local_49 = Arena::SkipDeleteList<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               (0);
          t_8 = &local_78;
          local_78.super_RepeatedPtrFieldBase.arena_ = (Arena *)pRVar2;
          local_48 = pRVar2;
          pRVar14 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)Arena::AllocateAligned
                                 ((Arena *)pRVar2,
                                  (type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,
                                  0x18);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::RepeatedPtrField(pRVar14,(t_8->super_RepeatedPtrFieldBase).arena_);
          local_60 = pRVar14;
          if ((local_49 & 1) == 0) {
            Arena::AddListNode((Arena *)pRVar2,pRVar14,
                               arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                              );
          }
          local_260 = local_60;
        }
        (pEStack_398->field_0).repeated_string_value = local_260;
      }
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::MergeFrom((pEStack_398->field_0).repeated_string_value,
                  (extension->field_0).repeated_string_value);
      break;
    case CPPTYPE_MESSAGE:
      if ((local_399 & 1) != 0) {
        pRVar2 = (Rep *)this->arena_;
        local_248 = pRVar2;
        if (pRVar2 == (Rep *)0x0) {
          pRVar15 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
          RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField(pRVar15);
          local_240 = pRVar15;
        }
        else {
          local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
          local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
          local_40.super_RepeatedPtrFieldBase.rep_ = pRVar2;
          local_11 = Arena::
                     SkipDeleteList<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                               (0);
          t_9 = &local_40;
          local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)pRVar2;
          local_10 = pRVar2;
          pRVar15 = (RepeatedPtrField<google::protobuf::MessageLite> *)
                    Arena::AllocateAligned
                              ((Arena *)pRVar2,
                               (type_info *)
                               &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
          RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                    (pRVar15,(t_9->super_RepeatedPtrFieldBase).arena_);
          local_28 = pRVar15;
          if ((local_11 & 1) == 0) {
            Arena::AddListNode((Arena *)pRVar2,pRVar15,
                               arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                              );
          }
          local_240 = local_28;
        }
        (pEStack_398->field_0).repeated_message_value = local_240;
      }
      pRStack_478 = (extension->field_0).repeated_message_value;
      for (other_message._4_4_ = 0; iVar5 = other_message._4_4_,
          iVar4 = RepeatedPtrField<google::protobuf::MessageLite>::size(pRStack_478), iVar5 < iVar4;
          other_message._4_4_ = other_message._4_4_ + 1) {
        target = RepeatedPtrField<google::protobuf::MessageLite>::Get
                           (pRStack_478,other_message._4_4_);
        extension_1 = (Extension *)
                      RepeatedPtrFieldBase::
                      AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                                ((RepeatedPtrFieldBase *)(pEStack_398->field_0).string_value);
        if (extension_1 == (Extension *)0x0) {
          iVar5 = (*target->_vptr_MessageLite[4])(target,this->arena_);
          extension_1 = (Extension *)CONCAT44(extraout_var,iVar5);
          RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
                    ((pEStack_398->field_0).repeated_message_value,(MessageLite *)extension_1);
        }
        (**(code **)((extension_1->field_0).int64_value + 0x50))(extension_1,target);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
  int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new = MaybeNewExtension(number, other_extension.descriptor,
                                    &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)                    \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                             \
        if (is_new) {                                                       \
          extension->repeated_##LOWERCASE##_value =                         \
            Arena::CreateMessage<REPEATED_TYPE >(arena_);                   \
        }                                                                   \
        extension->repeated_##LOWERCASE##_value->MergeFrom(                 \
          *other_extension.repeated_##LOWERCASE##_value);                   \
        break;

      HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
      HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
      HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
      HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
      HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
      HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
      HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
      HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
      HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target = extension->repeated_message_value
                   ->AddFromCleared<GenericTypeHandler<MessageLite> >();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                       \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
          Set##CAMELCASE(number, other_extension.type,                     \
                         other_extension.LOWERCASE##_value,                \
                         other_extension.descriptor);                      \
          break;

        HANDLE_TYPE( INT32,  int32,  Int32);
        HANDLE_TYPE( INT64,  int64,  Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE( FLOAT,  float,  Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(  BOOL,   bool,   Bool);
        HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type,
                    *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new = MaybeNewExtension(number,
                                          other_extension.descriptor,
                                          &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value->MutableMessage(
                    *other_extension.message_value)->CheckTypeAndMergeFrom(
                        *other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}